

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::type_to_array_glsl_abi_cxx11_
          (CompilerGLSL *this,SPIRType *type,uint32_t param_2)

{
  bool bVar1;
  size_t sVar2;
  CompilerError *this_00;
  undefined4 in_register_00000014;
  undefined1 local_c8 [40];
  uint32_t i_1;
  undefined1 local_80 [32];
  undefined1 local_60 [44];
  uint32_t i;
  allocator local_25 [5];
  long lStack_20;
  uint32_t param_2_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  string *res;
  
  lStack_20 = CONCAT44(in_register_00000014,param_2);
  type_local = type;
  this_local = this;
  if ((((*(byte *)(lStack_20 + 0x7c) & 1) == 0) || (*(int *)(lStack_20 + 0x90) != 0x14e5)) ||
     (*(int *)(lStack_20 + 0x10) == 0xf)) {
    bVar1 = VectorView<unsigned_int>::empty((VectorView<unsigned_int> *)(lStack_20 + 0x20));
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"",(allocator *)(local_60 + 0x2b));
      ::std::allocator<char>::~allocator((allocator<char> *)(local_60 + 0x2b));
    }
    else if ((type[0x15].member_type_index_redirection.stack_storage.aligned_char[0x1a] & 1U) == 0)
    {
      sVar2 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(lStack_20 + 0x20));
      if (1 < sVar2) {
        if (((type[0x15].member_type_index_redirection.stack_storage.aligned_char[0x10] & 1U) == 0)
           && (*(uint *)(type[0x15].member_type_index_redirection.stack_storage.aligned_char + 0xc)
               < 0x1ae)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&i_1,"GL_ARB_arrays_of_arrays",(allocator *)(local_c8 + 0x27));
          require_extension_internal((CompilerGLSL *)type,(string *)&i_1);
          ::std::__cxx11::string::~string((string *)&i_1);
          ::std::allocator<char>::~allocator((allocator<char> *)(local_c8 + 0x27));
        }
        else if (((type[0x15].member_type_index_redirection.stack_storage.aligned_char[0x10] & 1U)
                  != 0) &&
                (*(uint *)(type[0x15].member_type_index_redirection.stack_storage.aligned_char + 0xc
                          ) < 0x136)) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (this_00,
                     "Arrays of arrays not supported before ESSL version 310. Try using --flatten-multidimensional-arrays or set options.flatten_multidimensional_arrays to true."
                    );
          __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
      }
      local_c8[0x26] = 0;
      ::std::__cxx11::string::string((string *)this);
      sVar2 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(lStack_20 + 0x20));
      for (local_c8._32_4_ = (undefined4)sVar2; local_c8._32_4_ != 0;
          local_c8._32_4_ = local_c8._32_4_ + -1) {
        ::std::__cxx11::string::operator+=((string *)this,"[");
        to_array_size_abi_cxx11_((CompilerGLSL *)local_c8,type,(uint32_t)lStack_20);
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_c8);
        ::std::__cxx11::string::~string((string *)local_c8);
        ::std::__cxx11::string::operator+=((string *)this,"]");
      }
    }
    else {
      local_60[0x2a] = '\0';
      ::std::__cxx11::string::string((string *)this);
      ::std::__cxx11::string::operator+=((string *)this,"[");
      sVar2 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(lStack_20 + 0x20));
      for (local_60._36_4_ = (undefined4)sVar2; local_60._36_4_ != 0;
          local_60._36_4_ = local_60._36_4_ - 1) {
        to_array_size_abi_cxx11_((CompilerGLSL *)local_80,type,(uint32_t)lStack_20);
        enclose_expression((CompilerGLSL *)local_60,(string *)type);
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_60);
        ::std::__cxx11::string::~string((string *)local_60);
        ::std::__cxx11::string::~string((string *)local_80);
        if (1 < (uint)local_60._36_4_) {
          ::std::__cxx11::string::operator+=((string *)this," * ");
        }
      }
      ::std::__cxx11::string::operator+=((string *)this,"]");
    }
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"",local_25);
    ::std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  return this;
}

Assistant:

string CompilerGLSL::type_to_array_glsl(const SPIRType &type, uint32_t)
{
	if (type.pointer && type.storage == StorageClassPhysicalStorageBufferEXT && type.basetype != SPIRType::Struct)
	{
		// We are using a wrapped pointer type, and we should not emit any array declarations here.
		return "";
	}

	if (type.array.empty())
		return "";

	if (options.flatten_multidimensional_arrays)
	{
		string res;
		res += "[";
		for (auto i = uint32_t(type.array.size()); i; i--)
		{
			res += enclose_expression(to_array_size(type, i - 1));
			if (i > 1)
				res += " * ";
		}
		res += "]";
		return res;
	}
	else
	{
		if (type.array.size() > 1)
		{
			if (!options.es && options.version < 430)
				require_extension_internal("GL_ARB_arrays_of_arrays");
			else if (options.es && options.version < 310)
				SPIRV_CROSS_THROW("Arrays of arrays not supported before ESSL version 310. "
				                  "Try using --flatten-multidimensional-arrays or set "
				                  "options.flatten_multidimensional_arrays to true.");
		}

		string res;
		for (auto i = uint32_t(type.array.size()); i; i--)
		{
			res += "[";
			res += to_array_size(type, i - 1);
			res += "]";
		}
		return res;
	}
}